

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::Print(TPZGeoBlend<pzgeom::TPZGeoQuad> *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  int64_t iVar3;
  ostream *in_RSI;
  TPZNodeRep<4,_pztopology::TPZQuadrilateral> *in_RDI;
  int is;
  ostream *in_stack_ffffffffffffffd8;
  int local_14;
  
  TPZNodeRep<4,_pztopology::TPZQuadrilateral>::Print(in_RDI,in_stack_ffffffffffffffd8);
  std::operator<<(in_RSI,"Neighbours/transformations used for mapping the sides :\n");
  for (local_14 = 4; local_14 < 9; local_14 = local_14 + 1) {
    poVar2 = std::operator<<(in_RSI,"Side: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    poVar2 = std::operator<<(poVar2," El/side: ");
    iVar3 = TPZGeoElSideIndex::ElementIndex
                      ((TPZGeoElSideIndex *)(in_RDI[1].fNodeIndexes + (long)(local_14 + -4) * 3));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
    poVar2 = std::operator<<(poVar2,":");
    iVar1 = TPZGeoElSideIndex::Side
                      ((TPZGeoElSideIndex *)(in_RDI[1].fNodeIndexes + (long)(local_14 + -4) * 3));
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::operator<<(poVar2,'\n');
  }
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::Print(std::ostream &out) const
{
	TGeo::Print(out);
	out << "Neighbours/transformations used for mapping the sides :\n";
	int is;
	for(is=TGeo::NNodes; is<TGeo::NSides; is++)
	{
        out << "Side: " << is << " El/side: " << fNeighbours[is-TGeo::NNodes].ElementIndex() << ":" <<
        fNeighbours[is-TGeo::NNodes].Side() << '\n';
	}
}